

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

int av1_add_film_grain(aom_film_grain_t *params,aom_image_t *src,aom_image_t *dst)

{
  int iVar1;
  int *in_RDX;
  int *in_RSI;
  int mc_identity;
  int chroma_subsamp_y;
  int chroma_subsamp_x;
  int use_high_bit_depth;
  int chroma_stride;
  int luma_stride;
  int width;
  int height;
  uint8_t *cr;
  uint8_t *cb;
  uint8_t *luma;
  int in_stack_000005a8;
  int in_stack_000005ac;
  uint8_t *in_stack_000005b0;
  uint8_t *in_stack_000005b8;
  uint8_t *in_stack_000005c0;
  aom_film_grain_t *in_stack_000005c8;
  int in_stack_00000610;
  int in_stack_00000618;
  int in_stack_00000620;
  int in_stack_00000628;
  int in_stack_00000630;
  int in_stack_00000638;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_64;
  
  iVar1 = *in_RSI;
  if ((iVar1 == 0x102) || (iVar1 == 0x104)) {
    local_64 = 0;
  }
  else if (iVar1 == 0x105) {
    local_64 = 0;
  }
  else if (iVar1 == 0x106) {
    local_64 = 0;
  }
  else if (iVar1 == 0x902) {
    local_64 = 1;
  }
  else if (iVar1 == 0x905) {
    local_64 = 1;
  }
  else {
    if (iVar1 != 0x906) {
      fprintf(_stderr,"Film grain error: input format is not supported!");
      return -1;
    }
    local_64 = 1;
  }
  *in_RDX = *in_RSI;
  in_RDX[9] = in_RSI[9];
  in_RDX[0xc] = in_RSI[0xc];
  in_RDX[0xd] = in_RSI[0xd];
  in_RDX[10] = in_RSI[10];
  in_RDX[0xb] = in_RSI[0xb];
  in_RDX[1] = in_RSI[1];
  in_RDX[2] = in_RSI[2];
  in_RDX[3] = in_RSI[3];
  in_RDX[4] = in_RSI[4];
  in_RDX[5] = in_RSI[5];
  in_RDX[6] = in_RSI[6];
  in_RDX[0xe] = in_RSI[0xe];
  in_RDX[0xf] = in_RSI[0xf];
  in_RDX[0x1d] = in_RSI[0x1d];
  in_RDX[0x1e] = in_RSI[0x1e];
  copy_rect((uint8_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
            in_stack_ffffffffffffff5c,
            (uint8_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
            in_stack_ffffffffffffff4c,local_64,0,in_stack_ffffffffffffff70);
  extend_even((uint8_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
              in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
              in_stack_ffffffffffffff60);
  if (in_RSI[4] == 0) {
    copy_rect((uint8_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
              in_stack_ffffffffffffff5c,
              (uint8_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff4c,local_64,0,in_stack_ffffffffffffff70);
    copy_rect((uint8_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
              in_stack_ffffffffffffff5c,
              (uint8_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              in_stack_ffffffffffffff4c,local_64,0,in_stack_ffffffffffffff70);
  }
  iVar1 = add_film_grain_run(in_stack_000005c8,in_stack_000005c0,in_stack_000005b8,in_stack_000005b0
                             ,in_stack_000005ac,in_stack_000005a8,in_stack_00000610,
                             in_stack_00000618,in_stack_00000620,in_stack_00000628,in_stack_00000630
                             ,in_stack_00000638);
  return iVar1;
}

Assistant:

int av1_add_film_grain(const aom_film_grain_t *params, const aom_image_t *src,
                       aom_image_t *dst) {
  uint8_t *luma, *cb, *cr;
  int height, width, luma_stride, chroma_stride;
  int use_high_bit_depth = 0;
  int chroma_subsamp_x = 0;
  int chroma_subsamp_y = 0;
  int mc_identity = src->mc == AOM_CICP_MC_IDENTITY ? 1 : 0;

  switch (src->fmt) {
    case AOM_IMG_FMT_AOMI420:
    case AOM_IMG_FMT_I420:
      use_high_bit_depth = 0;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 1;
      break;
    case AOM_IMG_FMT_I42016:
      use_high_bit_depth = 1;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 1;
      break;
      //    case AOM_IMG_FMT_444A:
    case AOM_IMG_FMT_I444:
      use_high_bit_depth = 0;
      chroma_subsamp_x = 0;
      chroma_subsamp_y = 0;
      break;
    case AOM_IMG_FMT_I44416:
      use_high_bit_depth = 1;
      chroma_subsamp_x = 0;
      chroma_subsamp_y = 0;
      break;
    case AOM_IMG_FMT_I422:
      use_high_bit_depth = 0;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 0;
      break;
    case AOM_IMG_FMT_I42216:
      use_high_bit_depth = 1;
      chroma_subsamp_x = 1;
      chroma_subsamp_y = 0;
      break;
    default:  // unknown input format
      fprintf(stderr, "Film grain error: input format is not supported!");
      return -1;
  }

  assert(params->bit_depth == src->bit_depth);

  dst->fmt = src->fmt;
  dst->bit_depth = src->bit_depth;

  dst->r_w = src->r_w;
  dst->r_h = src->r_h;
  dst->d_w = src->d_w;
  dst->d_h = src->d_h;

  dst->cp = src->cp;
  dst->tc = src->tc;
  dst->mc = src->mc;

  dst->monochrome = src->monochrome;
  dst->csp = src->csp;
  dst->range = src->range;

  dst->x_chroma_shift = src->x_chroma_shift;
  dst->y_chroma_shift = src->y_chroma_shift;

  dst->temporal_id = src->temporal_id;
  dst->spatial_id = src->spatial_id;

  width = src->d_w % 2 ? src->d_w + 1 : src->d_w;
  height = src->d_h % 2 ? src->d_h + 1 : src->d_h;

  copy_rect(src->planes[AOM_PLANE_Y], src->stride[AOM_PLANE_Y],
            dst->planes[AOM_PLANE_Y], dst->stride[AOM_PLANE_Y], src->d_w,
            src->d_h, use_high_bit_depth);
  // Note that dst is already assumed to be aligned to even.
  extend_even(dst->planes[AOM_PLANE_Y], dst->stride[AOM_PLANE_Y], src->d_w,
              src->d_h, use_high_bit_depth);

  if (!src->monochrome) {
    copy_rect(src->planes[AOM_PLANE_U], src->stride[AOM_PLANE_U],
              dst->planes[AOM_PLANE_U], dst->stride[AOM_PLANE_U],
              width >> chroma_subsamp_x, height >> chroma_subsamp_y,
              use_high_bit_depth);

    copy_rect(src->planes[AOM_PLANE_V], src->stride[AOM_PLANE_V],
              dst->planes[AOM_PLANE_V], dst->stride[AOM_PLANE_V],
              width >> chroma_subsamp_x, height >> chroma_subsamp_y,
              use_high_bit_depth);
  }

  luma = dst->planes[AOM_PLANE_Y];
  cb = dst->planes[AOM_PLANE_U];
  cr = dst->planes[AOM_PLANE_V];

  // luma and chroma strides in samples
  luma_stride = dst->stride[AOM_PLANE_Y] >> use_high_bit_depth;
  chroma_stride = dst->stride[AOM_PLANE_U] >> use_high_bit_depth;

  return add_film_grain_run(params, luma, cb, cr, height, width, luma_stride,
                            chroma_stride, use_high_bit_depth, chroma_subsamp_y,
                            chroma_subsamp_x, mc_identity);
}